

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool ConnectionExists(Curl_easy *data,connectdata *needle,connectdata **usethis,_Bool *force_reuse,
                      _Bool *waitpipe)

{
  ssl_connection_state sVar1;
  connectdata *conn;
  bool bVar2;
  bool bVar3;
  curl_llist_element *pcVar4;
  connectdata *pcVar5;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  curlntlm cVar9;
  connectbundle *pcVar10;
  curl_llist_element *pcVar11;
  Curl_easy *handle;
  Curl_easy *handle_00;
  bool bVar12;
  bool bVar13;
  char *local_d0;
  char *local_b8;
  curl_llist_element *local_a8;
  Curl_easy *rh;
  Curl_easy *sh;
  size_t pipeLen;
  curl_llist_element *pcStack_78;
  _Bool match;
  curl_llist_element *curr;
  size_t best_pipe_len;
  size_t max_pipe_len;
  _Bool wantProxyNTLMhttp;
  _Bool wantNTLMhttp;
  connectbundle *bundle;
  int canpipe;
  _Bool foundPendingCandidate;
  connectdata *chosen;
  connectdata *check;
  _Bool *waitpipe_local;
  _Bool *force_reuse_local;
  connectdata **usethis_local;
  connectdata *needle_local;
  Curl_easy *data_local;
  
  _canpipe = (connectdata *)0x0;
  bVar3 = false;
  bundle._0_4_ = IsPipeliningPossible(data,needle);
  bVar12 = false;
  if (((data->state).authhost.want & 0x28) != 0) {
    bVar12 = (needle->handler->protocol & 3) != 0;
  }
  bVar13 = false;
  if ((((needle->bits).proxy_user_passwd & 1U) != 0) &&
     (bVar13 = false, ((data->state).authproxy.want & 0x28) != 0)) {
    bVar13 = (needle->handler->protocol & 3) != 0;
  }
  *force_reuse = false;
  *waitpipe = false;
  if ((((uint)bundle & 1) != 0) && (_Var6 = Curl_pipeline_site_blacklisted(data,needle), _Var6)) {
    bundle._0_4_ = (uint)bundle & 0xfffffffe;
  }
  pcVar10 = Curl_conncache_find_bundle(needle,(data->state).conn_cache);
  conn = _canpipe;
  if (pcVar10 != (connectbundle *)0x0) {
    if (pcVar10->multiuse == 2) {
      local_a8 = (curl_llist_element *)0x0;
    }
    else {
      local_a8 = (curl_llist_element *)max_pipeline_length(data->multi);
    }
    curr = local_a8;
    if (((needle->bits).conn_to_host & 1U) == 0) {
      local_b8 = (needle->host).name;
    }
    else {
      local_b8 = (needle->conn_to_host).name;
    }
    if (pcVar10->multiuse == 1) {
      local_d0 = "can pipeline";
    }
    else {
      local_d0 = "serially";
      if (pcVar10->multiuse == 2) {
        local_d0 = "can multiplex";
      }
    }
    Curl_infof(data,"Found bundle for host %s: %p [%s]\n",local_b8,pcVar10,local_d0);
    if ((uint)bundle != 0) {
      if (pcVar10->multiuse < 1) {
        if ((pcVar10->multiuse == 0) && (((data->set).pipewait & 1U) != 0)) {
          Curl_infof(data,"Server doesn\'t support multi-use yet, wait\n");
          *waitpipe = true;
          Curl_conncache_unlock(needle);
          return false;
        }
        Curl_infof(data,"Server doesn\'t support multi-use (yet)\n");
        bundle._0_4_ = 0;
      }
      if ((pcVar10->multiuse != 1) || (_Var6 = Curl_pipeline_wanted(data->multi,1), _Var6)) {
        if ((pcVar10->multiuse == 2) && (_Var6 = Curl_pipeline_wanted(data->multi,2), !_Var6)) {
          Curl_infof(data,"Could multiplex, but not asked to!\n");
          bundle._0_4_ = 0;
        }
      }
      else {
        Curl_infof(data,"Could pipeline, but not asked to!\n");
        bundle._0_4_ = 0;
      }
    }
    pcStack_78 = (pcVar10->conn_list).head;
    pcVar4 = curr;
    pcVar5 = _canpipe;
LAB_0012880a:
    while( true ) {
      _canpipe = pcVar5;
      curr = pcVar4;
      conn = _canpipe;
      if (pcStack_78 == (curl_llist_element *)0x0) goto LAB_00129139;
      bVar2 = false;
      conn = (connectdata *)pcStack_78->ptr;
      pcStack_78 = pcStack_78->next;
      _Var6 = extract_if_dead(conn,data);
      pcVar4 = curr;
      pcVar5 = _canpipe;
      if (!_Var6) break;
      Curl_disconnect(conn,true);
    }
    pcVar11 = (curl_llist_element *)((conn->send_pipe).size + (conn->recv_pipe).size);
    if ((uint)bundle == 0) {
      if (pcVar11 != (curl_llist_element *)0x0) goto LAB_0012880a;
      if (conn->ip_addr_str[0] == '\0') {
        Curl_infof(data,"Connection #%ld is still name resolving, can\'t reuse\n",
                   conn->connection_id);
        goto LAB_0012880a;
      }
      if ((conn->sock[0] == -1) || (((conn->bits).close & 1U) != 0)) {
        if (((conn->bits).close & 1U) == 0) {
          bVar3 = true;
        }
        Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",conn->connection_id);
        goto LAB_0012880a;
      }
    }
    else {
      if ((((conn->bits).protoconnstart & 1U) != 0) && (((conn->bits).close & 1U) != 0))
      goto LAB_0012880a;
      if (((conn->bits).multiplex & 1U) == 0) {
        handle = gethandleathead(&conn->send_pipe);
        handle_00 = gethandleathead(&conn->recv_pipe);
        if (handle == (Curl_easy *)0x0) {
          if (handle_00 == (Curl_easy *)0x0) goto LAB_001289bc;
          uVar7 = IsPipeliningPossible(handle_00,conn);
        }
        else {
          uVar7 = IsPipeliningPossible(handle,conn);
        }
        if ((uVar7 & 1) == 0) goto LAB_0012880a;
      }
    }
LAB_001289bc:
    if (needle->unix_domain_socket == (char *)0x0) {
      if (conn->unix_domain_socket != (char *)0x0) goto LAB_0012880a;
    }
    else if (((conn->unix_domain_socket == (char *)0x0) ||
             (iVar8 = strcmp(needle->unix_domain_socket,conn->unix_domain_socket), iVar8 != 0)) ||
            ((needle->abstract_unix_socket & 1U) != (conn->abstract_unix_socket & 1U)))
    goto LAB_0012880a;
    if ((((((needle->handler->flags & 1) == (conn->handler->flags & 1)) ||
          ((uVar7 = get_protocol_family(conn->handler->protocol), uVar7 == needle->handler->protocol
           && ((conn->tls_upgraded & 1U) != 0)))) &&
         (((needle->bits).httpproxy & 1U) == ((conn->bits).httpproxy & 1U))) &&
        ((((needle->bits).socksproxy & 1U) == ((conn->bits).socksproxy & 1U) &&
         ((((needle->bits).socksproxy & 1U) == 0 ||
          (_Var6 = proxy_info_matches(&needle->socks_proxy,&conn->socks_proxy), _Var6)))))) &&
       ((((needle->bits).conn_to_host & 1U) == ((conn->bits).conn_to_host & 1U) &&
        (((needle->bits).conn_to_port & 1U) == ((conn->bits).conn_to_port & 1U))))) {
      if (((needle->bits).httpproxy & 1U) != 0) {
        _Var6 = proxy_info_matches(&needle->http_proxy,&conn->http_proxy);
        if ((!_Var6) || (((needle->bits).tunnel_proxy & 1U) != ((conn->bits).tunnel_proxy & 1U)))
        goto LAB_0012880a;
        if ((needle->http_proxy).proxytype == CURLPROXY_HTTPS) {
          if ((needle->handler->flags & 1) == 0) {
            _Var6 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config);
            if (!_Var6) goto LAB_0012880a;
            sVar1 = conn->ssl[0].state;
          }
          else {
            _Var6 = Curl_ssl_config_matches(&needle->proxy_ssl_config,&conn->proxy_ssl_config);
            if (!_Var6) goto LAB_0012880a;
            sVar1 = conn->proxy_ssl[0].state;
          }
          if (sVar1 != ssl_connection_complete) goto LAB_0012880a;
        }
      }
      if ((((((uint)bundle != 0) || ((conn->inuse & 1U) == 0)) &&
           (((conn->inuse & 1U) == 0 || (conn->data->multi == needle->data->multi)))) &&
          (((needle->localdev == (char *)0x0 && (needle->localport == 0)) ||
           (((conn->localport == needle->localport &&
             (conn->localportrange == needle->localportrange)) &&
            ((needle->localdev == (char *)0x0 ||
             ((conn->localdev != (char *)0x0 &&
              (iVar8 = strcmp(conn->localdev,needle->localdev), iVar8 == 0)))))))))) &&
         (((needle->handler->flags & 0x80) != 0 ||
          ((iVar8 = strcmp(needle->user,conn->user), iVar8 == 0 &&
           (iVar8 = strcmp(needle->passwd,conn->passwd), iVar8 == 0)))))) {
        if ((((needle->bits).httpproxy & 1U) == 0) ||
           (((needle->handler->flags & 1) != 0 || (((needle->bits).tunnel_proxy & 1U) != 0)))) {
          iVar8 = Curl_strcasecompare(needle->handler->scheme,conn->handler->scheme);
          if (((iVar8 != 0) ||
              ((uVar7 = get_protocol_family(conn->handler->protocol),
               uVar7 == needle->handler->protocol && ((conn->tls_upgraded & 1U) != 0)))) &&
             (((((needle->bits).conn_to_host & 1U) == 0 ||
               (iVar8 = Curl_strcasecompare((needle->conn_to_host).name,(conn->conn_to_host).name),
               iVar8 != 0)) &&
              ((((((needle->bits).conn_to_port & 1U) == 0 ||
                 (needle->conn_to_port == conn->conn_to_port)) &&
                (iVar8 = Curl_strcasecompare((needle->host).name,(conn->host).name), iVar8 != 0)) &&
               (needle->remote_port == conn->remote_port)))))) {
            if ((needle->handler->flags & 1) != 0) {
              _Var6 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config);
              if (!_Var6) goto LAB_0012880a;
              if (conn->ssl[0].state != ssl_connection_complete) {
                bVar3 = true;
                goto LAB_0012880a;
              }
            }
            bVar2 = true;
          }
        }
        else {
          bVar2 = true;
        }
        if (!bVar2) {
LAB_00129132:
          pcVar4 = curr;
          pcVar5 = _canpipe;
          goto LAB_0012880a;
        }
        if (bVar12) {
          iVar8 = strcmp(needle->user,conn->user);
          if (iVar8 != 0) goto LAB_0012880a;
          cVar9 = strcmp(needle->passwd,conn->passwd);
        }
        else {
          cVar9 = (conn->ntlm).state;
        }
        if (cVar9 == NTLMSTATE_NONE) {
          if (bVar13) {
            if ((((conn->http_proxy).user == (char *)0x0) ||
                ((conn->http_proxy).passwd == (char *)0x0)) ||
               (iVar8 = strcmp((needle->http_proxy).user,(conn->http_proxy).user), iVar8 != 0))
            goto LAB_0012880a;
            cVar9 = strcmp((needle->http_proxy).passwd,(conn->http_proxy).passwd);
          }
          else {
            cVar9 = (conn->proxyntlm).state;
          }
          if (cVar9 == NTLMSTATE_NONE) {
            pcVar5 = conn;
            if ((bVar12) || (bVar13)) {
              if (((bVar12) && ((conn->ntlm).state != NTLMSTATE_NONE)) ||
                 ((bVar13 && ((conn->proxyntlm).state != NTLMSTATE_NONE)))) goto LAB_0012905b;
            }
            else {
              if (((uint)bundle == 0) || (pcVar11 == (curl_llist_element *)0x0)) goto LAB_00129139;
              if ((local_a8 == (curl_llist_element *)0x0) || (pcVar11 < local_a8)) {
                _Var6 = Curl_pipeline_penalized(data,conn);
                if (_Var6) {
                  Curl_infof(data,"Penalized, skip\n");
                  pcVar5 = _canpipe;
                }
                else {
                  if (local_a8 == (curl_llist_element *)0x0) {
                    Curl_infof(data,"Multiplexed connection found!\n");
                    goto LAB_00129139;
                  }
                  pcVar4 = pcVar11;
                  if (curr <= pcVar11) goto LAB_00129132;
                }
              }
              else {
                Curl_infof(data,"Pipe is full, skip (%zu)\n",pcVar11);
                pcVar5 = _canpipe;
              }
            }
          }
        }
      }
    }
    goto LAB_0012880a;
  }
LAB_00129139:
  _canpipe = conn;
  if (_canpipe == (connectdata *)0x0) {
    Curl_conncache_unlock(needle);
    if ((bVar3) && (((data->set).pipewait & 1U) != 0)) {
      Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
      *waitpipe = true;
    }
    data_local._7_1_ = false;
  }
  else {
    _canpipe->inuse = true;
    Curl_conncache_unlock(needle);
    *usethis = _canpipe;
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
LAB_0012905b:
  *force_reuse = true;
  goto LAB_00129139;
}

Assistant:

static bool
ConnectionExists(struct Curl_easy *data,
                 struct connectdata *needle,
                 struct connectdata **usethis,
                 bool *force_reuse,
                 bool *waitpipe)
{
  struct connectdata *check;
  struct connectdata *chosen = 0;
  bool foundPendingCandidate = FALSE;
  int canpipe = IsPipeliningPossible(data, needle);
  struct connectbundle *bundle;

#ifdef USE_NTLM
  bool wantNTLMhttp = ((data->state.authhost.want &
                      (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                      (needle->handler->protocol & PROTO_FAMILY_HTTP));
  bool wantProxyNTLMhttp = (needle->bits.proxy_user_passwd &&
                           ((data->state.authproxy.want &
                           (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                           (needle->handler->protocol & PROTO_FAMILY_HTTP)));
#endif

  *force_reuse = FALSE;
  *waitpipe = FALSE;

  /* We can't pipeline if the site is blacklisted */
  if((canpipe & CURLPIPE_HTTP1) &&
     Curl_pipeline_site_blacklisted(data, needle))
    canpipe &= ~ CURLPIPE_HTTP1;

  /* Look up the bundle with all the connections to this particular host.
     Locks the connection cache, beware of early returns! */
  bundle = Curl_conncache_find_bundle(needle, data->state.conn_cache);
  if(bundle) {
    /* Max pipe length is zero (unlimited) for multiplexed connections */
    size_t max_pipe_len = (bundle->multiuse != BUNDLE_MULTIPLEX)?
      max_pipeline_length(data->multi):0;
    size_t best_pipe_len = max_pipe_len;
    struct curl_llist_element *curr;

    infof(data, "Found bundle for host %s: %p [%s]\n",
          (needle->bits.conn_to_host ? needle->conn_to_host.name :
           needle->host.name), (void *)bundle,
          (bundle->multiuse == BUNDLE_PIPELINING ?
           "can pipeline" :
           (bundle->multiuse == BUNDLE_MULTIPLEX ?
            "can multiplex" : "serially")));

    /* We can't pipeline if we don't know anything about the server */
    if(canpipe) {
      if(bundle->multiuse <= BUNDLE_UNKNOWN) {
        if((bundle->multiuse == BUNDLE_UNKNOWN) && data->set.pipewait) {
          infof(data, "Server doesn't support multi-use yet, wait\n");
          *waitpipe = TRUE;
          Curl_conncache_unlock(needle);
          return FALSE; /* no re-use */
        }

        infof(data, "Server doesn't support multi-use (yet)\n");
        canpipe = 0;
      }
      if((bundle->multiuse == BUNDLE_PIPELINING) &&
         !Curl_pipeline_wanted(data->multi, CURLPIPE_HTTP1)) {
        /* not asked for, switch off */
        infof(data, "Could pipeline, but not asked to!\n");
        canpipe = 0;
      }
      else if((bundle->multiuse == BUNDLE_MULTIPLEX) &&
              !Curl_pipeline_wanted(data->multi, CURLPIPE_MULTIPLEX)) {
        infof(data, "Could multiplex, but not asked to!\n");
        canpipe = 0;
      }
    }

    curr = bundle->conn_list.head;
    while(curr) {
      bool match = FALSE;
      size_t pipeLen;

      /*
       * Note that if we use a HTTP proxy in normal mode (no tunneling), we
       * check connections to that proxy and not to the actual remote server.
       */
      check = curr->ptr;
      curr = curr->next;

      if(extract_if_dead(check, data)) {
        /* disconnect it */
        (void)Curl_disconnect(check, /* dead_connection */TRUE);
        continue;
      }

      pipeLen = check->send_pipe.size + check->recv_pipe.size;

      if(canpipe) {
        if(check->bits.protoconnstart && check->bits.close)
          continue;

        if(!check->bits.multiplex) {
          /* If not multiplexing, make sure the connection is fine for HTTP/1
             pipelining */
          struct Curl_easy* sh = gethandleathead(&check->send_pipe);
          struct Curl_easy* rh = gethandleathead(&check->recv_pipe);
          if(sh) {
            if(!(IsPipeliningPossible(sh, check) & CURLPIPE_HTTP1))
              continue;
          }
          else if(rh) {
            if(!(IsPipeliningPossible(rh, check) & CURLPIPE_HTTP1))
              continue;
          }
        }
      }
      else {
        if(pipeLen > 0) {
          /* can only happen within multi handles, and means that another easy
             handle is using this connection */
          continue;
        }

        if(Curl_resolver_asynch()) {
          /* ip_addr_str[0] is NUL only if the resolving of the name hasn't
             completed yet and until then we don't re-use this connection */
          if(!check->ip_addr_str[0]) {
            infof(data,
                  "Connection #%ld is still name resolving, can't reuse\n",
                  check->connection_id);
            continue;
          }
        }

        if((check->sock[FIRSTSOCKET] == CURL_SOCKET_BAD) ||
           check->bits.close) {
          if(!check->bits.close)
            foundPendingCandidate = TRUE;
          /* Don't pick a connection that hasn't connected yet or that is going
             to get closed. */
          infof(data, "Connection #%ld isn't open enough, can't reuse\n",
                check->connection_id);
#ifdef DEBUGBUILD
          if(check->recv_pipe.size > 0) {
            infof(data,
                  "BAD! Unconnected #%ld has a non-empty recv pipeline!\n",
                  check->connection_id);
          }
#endif
          continue;
        }
      }

#ifdef USE_UNIX_SOCKETS
      if(needle->unix_domain_socket) {
        if(!check->unix_domain_socket)
          continue;
        if(strcmp(needle->unix_domain_socket, check->unix_domain_socket))
          continue;
        if(needle->abstract_unix_socket != check->abstract_unix_socket)
          continue;
      }
      else if(check->unix_domain_socket)
        continue;
#endif

      if((needle->handler->flags&PROTOPT_SSL) !=
         (check->handler->flags&PROTOPT_SSL))
        /* don't do mixed SSL and non-SSL connections */
        if(get_protocol_family(check->handler->protocol) !=
           needle->handler->protocol || !check->tls_upgraded)
          /* except protocols that have been upgraded via TLS */
          continue;

      if(needle->bits.httpproxy != check->bits.httpproxy ||
         needle->bits.socksproxy != check->bits.socksproxy)
        continue;

      if(needle->bits.socksproxy && !proxy_info_matches(&needle->socks_proxy,
                                                        &check->socks_proxy))
        continue;

      if(needle->bits.conn_to_host != check->bits.conn_to_host)
        /* don't mix connections that use the "connect to host" feature and
         * connections that don't use this feature */
        continue;

      if(needle->bits.conn_to_port != check->bits.conn_to_port)
        /* don't mix connections that use the "connect to port" feature and
         * connections that don't use this feature */
        continue;

      if(needle->bits.httpproxy) {
        if(!proxy_info_matches(&needle->http_proxy, &check->http_proxy))
          continue;

        if(needle->bits.tunnel_proxy != check->bits.tunnel_proxy)
          continue;

        if(needle->http_proxy.proxytype == CURLPROXY_HTTPS) {
          /* use https proxy */
          if(needle->handler->flags&PROTOPT_SSL) {
            /* use double layer ssl */
            if(!Curl_ssl_config_matches(&needle->proxy_ssl_config,
                                        &check->proxy_ssl_config))
              continue;
            if(check->proxy_ssl[FIRSTSOCKET].state != ssl_connection_complete)
              continue;
          }
          else {
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config))
              continue;
            if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete)
              continue;
          }
        }
      }

      if(!canpipe && check->inuse)
        /* this request can't be pipelined but the checked connection is
           already in use so we skip it */
        continue;

      if((check->inuse) && (check->data->multi != needle->data->multi))
        /* this could be subject for pipeline/multiplex use, but only
           if they belong to the same multi handle */
        continue;

      if(needle->localdev || needle->localport) {
        /* If we are bound to a specific local end (IP+port), we must not
           re-use a random other one, although if we didn't ask for a
           particular one we can reuse one that was bound.

           This comparison is a bit rough and too strict. Since the input
           parameters can be specified in numerous ways and still end up the
           same it would take a lot of processing to make it really accurate.
           Instead, this matching will assume that re-uses of bound connections
           will most likely also re-use the exact same binding parameters and
           missing out a few edge cases shouldn't hurt anyone very much.
        */
        if((check->localport != needle->localport) ||
           (check->localportrange != needle->localportrange) ||
           (needle->localdev &&
            (!check->localdev || strcmp(check->localdev, needle->localdev))))
          continue;
      }

      if(!(needle->handler->flags & PROTOPT_CREDSPERREQUEST)) {
        /* This protocol requires credentials per connection,
           so verify that we're using the same name and password as well */
        if(strcmp(needle->user, check->user) ||
           strcmp(needle->passwd, check->passwd)) {
          /* one of them was different */
          continue;
        }
      }

      if(!needle->bits.httpproxy || (needle->handler->flags&PROTOPT_SSL) ||
         needle->bits.tunnel_proxy) {
        /* The requested connection does not use a HTTP proxy or it uses SSL or
           it is a non-SSL protocol tunneled or it is a non-SSL protocol which
           is allowed to be upgraded via TLS */

        if((strcasecompare(needle->handler->scheme, check->handler->scheme) ||
            (get_protocol_family(check->handler->protocol) ==
             needle->handler->protocol && check->tls_upgraded)) &&
           (!needle->bits.conn_to_host || strcasecompare(
            needle->conn_to_host.name, check->conn_to_host.name)) &&
           (!needle->bits.conn_to_port ||
             needle->conn_to_port == check->conn_to_port) &&
           strcasecompare(needle->host.name, check->host.name) &&
           needle->remote_port == check->remote_port) {
          /* The schemes match or the the protocol family is the same and the
             previous connection was TLS upgraded, and the hostname and host
             port match */
          if(needle->handler->flags & PROTOPT_SSL) {
            /* This is a SSL connection so verify that we're using the same
               SSL options as well */
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config)) {
              DEBUGF(infof(data,
                           "Connection #%ld has different SSL parameters, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
            if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete) {
              foundPendingCandidate = TRUE;
              DEBUGF(infof(data,
                           "Connection #%ld has not started SSL connect, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
          }
          match = TRUE;
        }
      }
      else {
        /* The requested connection is using the same HTTP proxy in normal
           mode (no tunneling) */
        match = TRUE;
      }

      if(match) {
#if defined(USE_NTLM)
        /* If we are looking for an HTTP+NTLM connection, check if this is
           already authenticating with the right credentials. If not, keep
           looking so that we can reuse NTLM connections if
           possible. (Especially we must not reuse the same connection if
           partway through a handshake!) */
        if(wantNTLMhttp) {
          if(strcmp(needle->user, check->user) ||
             strcmp(needle->passwd, check->passwd))
            continue;
        }
        else if(check->ntlm.state != NTLMSTATE_NONE) {
          /* Connection is using NTLM auth but we don't want NTLM */
          continue;
        }

        /* Same for Proxy NTLM authentication */
        if(wantProxyNTLMhttp) {
          /* Both check->http_proxy.user and check->http_proxy.passwd can be
           * NULL */
          if(!check->http_proxy.user || !check->http_proxy.passwd)
            continue;

          if(strcmp(needle->http_proxy.user, check->http_proxy.user) ||
             strcmp(needle->http_proxy.passwd, check->http_proxy.passwd))
            continue;
        }
        else if(check->proxyntlm.state != NTLMSTATE_NONE) {
          /* Proxy connection is using NTLM auth but we don't want NTLM */
          continue;
        }

        if(wantNTLMhttp || wantProxyNTLMhttp) {
          /* Credentials are already checked, we can use this connection */
          chosen = check;

          if((wantNTLMhttp &&
             (check->ntlm.state != NTLMSTATE_NONE)) ||
              (wantProxyNTLMhttp &&
               (check->proxyntlm.state != NTLMSTATE_NONE))) {
            /* We must use this connection, no other */
            *force_reuse = TRUE;
            break;
          }

          /* Continue look up for a better connection */
          continue;
        }
#endif
        if(canpipe) {
          /* We can pipeline if we want to. Let's continue looking for
             the optimal connection to use, i.e the shortest pipe that is not
             blacklisted. */

          if(pipeLen == 0) {
            /* We have the optimal connection. Let's stop looking. */
            chosen = check;
            break;
          }

          /* We can't use the connection if the pipe is full */
          if(max_pipe_len && (pipeLen >= max_pipe_len)) {
            infof(data, "Pipe is full, skip (%zu)\n", pipeLen);
            continue;
          }
#ifdef USE_NGHTTP2
          /* If multiplexed, make sure we don't go over concurrency limit */
          if(check->bits.multiplex) {
            /* Multiplexed connections can only be HTTP/2 for now */
            struct http_conn *httpc = &check->proto.httpc;
            if(pipeLen >= httpc->settings.max_concurrent_streams) {
              infof(data, "MAX_CONCURRENT_STREAMS reached, skip (%zu)\n",
                    pipeLen);
              continue;
            }
          }
#endif
          /* We can't use the connection if the pipe is penalized */
          if(Curl_pipeline_penalized(data, check)) {
            infof(data, "Penalized, skip\n");
            continue;
          }

          if(max_pipe_len) {
            if(pipeLen < best_pipe_len) {
              /* This connection has a shorter pipe so far. We'll pick this
                 and continue searching */
              chosen = check;
              best_pipe_len = pipeLen;
              continue;
            }
          }
          else {
            /* When not pipelining (== multiplexed), we have a match here! */
            chosen = check;
            infof(data, "Multiplexed connection found!\n");
            break;
          }
        }
        else {
          /* We have found a connection. Let's stop searching. */
          chosen = check;
          break;
        }
      }
    }
  }

  if(chosen) {
    /* mark it as used before releasing the lock */
    chosen->inuse = TRUE;
    Curl_conncache_unlock(needle);
    *usethis = chosen;
    return TRUE; /* yes, we found one to use! */
  }
  Curl_conncache_unlock(needle);

  if(foundPendingCandidate && data->set.pipewait) {
    infof(data,
          "Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
    *waitpipe = TRUE;
  }

  return FALSE; /* no matching connecting exists */
}